

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O2

double recall_tree_ns::updated_entropy(recall_tree *b,uint32_t cn,example *ec)

{
  float fVar1;
  double n;
  double dVar2;
  node_pred *pnVar3;
  node *pnVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double __x;
  double n_00;
  double c;
  
  pnVar3 = find(b,cn,ec);
  pnVar4 = (b->nodes)._begin;
  dVar5 = 0.0;
  c = 0.0;
  if (pnVar3 != pnVar4[cn].preds._end) {
    c = pnVar3->label_count;
  }
  fVar1 = ec->weight;
  n = pnVar4[cn].n;
  n_00 = n + (double)fVar1;
  __x = n / n_00;
  if ((__x != 0.0) || (NAN(__x))) {
    dVar5 = log(__x);
    pnVar4 = (b->nodes)._begin;
  }
  dVar2 = pnVar4[cn].entropy;
  dVar6 = plogp(c,n);
  dVar7 = plogp((double)fVar1 + c,n_00);
  return ((dVar6 + dVar2) * __x - ((n - c) / n_00) * dVar5) - dVar7;
}

Assistant:

double updated_entropy(recall_tree& b, uint32_t cn, example& ec)
{
  node_pred* ls = find(b, cn, ec);

  // entropy = -\sum_k (c_k/n) Log[c_k/n]
  // c_0 <- c_0 + 1, n <- n + 1
  // entropy <- + (c_0/n) Log[c_0/n]
  //            - n/(n+1) \sum_{k>0} (c_k/n) Log[c_k/n]
  //            - Log[n/(n+1)] \sum_{k>0} (c_k/(n+1))
  //            - ((c_0+1)/(n+1)) Log[(c_0+1)/(n+1)]

  double c0 = (ls == b.nodes[cn].preds.end()) ? 0 : ls->label_count;
  double deltac0 = ec.weight;
  double n = b.nodes[cn].n;

  double novernp1 = n / (deltac0 + n);
  double lognovernp1 = (novernp1 == 0) ? 0 : log(novernp1);
  double nminusc0overnp1 = (n - c0) / (n + deltac0);

  double newentropy = b.nodes[cn].entropy;

  newentropy += plogp(c0, n);
  newentropy *= novernp1;
  newentropy -= lognovernp1 * nminusc0overnp1;
  newentropy -= plogp(c0 + deltac0, n + deltac0);

  return newentropy;
}